

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

bool __thiscall Glucose::SimpSolver::implied(SimpSolver *this,vec<Glucose::Lit> *c)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  CRef CVar4;
  byte bVar5;
  long lVar6;
  int local_2c;
  
  local_2c = (this->super_Solver).trail.sz;
  vec<int>::push(&(this->super_Solver).trail_lim,&local_2c);
  bVar2 = 0 < c->sz;
  if (0 < c->sz) {
    uVar1 = c->data->x;
    bVar3 = (this->super_Solver).assigns.data[(int)uVar1 >> 1].value;
    bVar5 = (byte)uVar1 & 1;
    if (bVar3 != bVar5) {
      lVar6 = 1;
      do {
        if ((bVar5 ^ bVar3) != 1) {
          Solver::uncheckedEnqueue(&this->super_Solver,(Lit)(uVar1 ^ 1),0xffffffff);
        }
        bVar2 = lVar6 < c->sz;
        if (c->sz <= lVar6) goto LAB_001158b8;
        uVar1 = c->data[lVar6].x;
        bVar3 = (this->super_Solver).assigns.data[(int)uVar1 >> 1].value;
        bVar5 = (byte)uVar1 & 1;
        lVar6 = lVar6 + 1;
      } while (bVar3 != bVar5);
    }
    Solver::cancelUntil(&this->super_Solver,0);
    if (bVar2) {
      return false;
    }
  }
LAB_001158b8:
  CVar4 = Solver::propagate(&this->super_Solver);
  Solver::cancelUntil(&this->super_Solver,0);
  return CVar4 != 0xffffffff;
}

Assistant:

bool SimpSolver::implied(const vec<Lit>& c)
{
    assert(decisionLevel() == 0);

    trail_lim.push(trail.size());
    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) == l_True){
            cancelUntil(0);
            return false;
        }else if (value(c[i]) != l_False){
            assert(value(c[i]) == l_Undef);
            uncheckedEnqueue(~c[i]);
        }

    bool result = propagate() != CRef_Undef;
    cancelUntil(0);
    return result;
}